

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::set_pattern(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
              *this,string_view pattern)

{
  bool bVar1;
  __shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<lwlog::interface::sink> *sink;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  *__range2;
  logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
  *this_local;
  string_view pattern_local;
  
  __end0 = std::
           vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
           ::begin(&(this->m_backend).sink_storage);
  sink = (shared_ptr<lwlog::interface::sink> *)
         std::
         vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
         ::end(&(this->m_backend).sink_storage);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
                                *)&sink);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
                 ::operator*(&__end0);
    peVar2 = std::
             __shared_ptr_access<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_sink[5])(peVar2,pattern._M_len,pattern._M_str);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<lwlog::interface::sink>_*,_std::vector<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::set_pattern(
		std::string_view pattern)
	{
		for (const auto& sink : m_backend.sink_storage)
		{ 
			sink->set_pattern(pattern);
		}
	}